

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

aiNode * __thiscall
Assimp::COBImporter::BuildNodes(COBImporter *this,Node *root,Scene *scin,aiScene *fill)

{
  ai_real aVar1;
  ai_real aVar2;
  ai_real aVar3;
  Type TVar4;
  uint uVar5;
  Shader SVar6;
  Face *pFVar7;
  pointer pVVar8;
  undefined8 uVar9;
  pointer pMVar10;
  element_type *peVar11;
  _Map_pointer pppNVar12;
  Node **ppNVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  aiScene *paVar30;
  undefined1 *puVar31;
  pointer pMVar32;
  uint uVar33;
  int iVar34;
  Material *m;
  aiNode *paVar35;
  aiMesh *paVar36;
  ulong uVar37;
  aiVector3D *paVar38;
  ulong *puVar39;
  aiFace *paVar40;
  long lVar41;
  uint *puVar42;
  pointer pVVar43;
  pointer pMVar44;
  Logger *this_00;
  pointer pMVar45;
  aiMaterial *this_01;
  _Rb_tree_node_base *p_Var46;
  aiLight *paVar47;
  aiCamera *paVar48;
  aiNode **__s;
  aiNode *paVar49;
  _Map_pointer pppFVar50;
  aiFace *paVar51;
  _Elt_pointer ppFVar52;
  Light *ndlight;
  Node **ppNVar53;
  _Elt_pointer ppFVar54;
  _Elt_pointer ppFVar55;
  ulong uVar56;
  Node **ppNVar57;
  size_t __n;
  deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *__range4;
  _Map_pointer pppNVar58;
  bool bVar59;
  unique_ptr<const_Assimp::COB::Material,_std::default_delete<const_Assimp::COB::Material>_> defmat;
  aiColor3D c;
  aiString s;
  pointer local_6a0;
  aiScene *local_698;
  aiNode *local_690;
  _Map_pointer local_688;
  Scene *local_680;
  _Elt_pointer local_678;
  shared_ptr<Assimp::COB::Texture> local_670;
  shared_ptr<Assimp::COB::Texture> local_660;
  shared_ptr<Assimp::COB::Texture> local_650;
  _Rb_tree_node_base *local_640;
  _Rb_tree_node_base *local_638;
  COBImporter *local_630;
  _Rb_tree_color local_628;
  _Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> local_620;
  undefined1 *local_5d0;
  ulong local_5c8;
  undefined1 local_5c0 [16];
  float local_5b0;
  float fStack_5ac;
  float local_5a8;
  undefined1 local_5a0 [96];
  ios_base local_540 [264];
  aiString local_438;
  
  local_698 = fill;
  local_680 = scin;
  local_630 = this;
  paVar35 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar35);
  uVar56 = (root->name)._M_string_length;
  if (uVar56 < 0x400) {
    (paVar35->mName).length = (ai_uint32)uVar56;
    memcpy((paVar35->mName).data,(root->name)._M_dataplus._M_p,uVar56);
    (paVar35->mName).data[uVar56] = '\0';
  }
  fVar26 = (root->transform).a1;
  fVar27 = (root->transform).a2;
  fVar28 = (root->transform).a3;
  fVar29 = (root->transform).a4;
  fVar22 = (root->transform).b1;
  fVar23 = (root->transform).b2;
  fVar24 = (root->transform).b3;
  fVar25 = (root->transform).b4;
  fVar18 = (root->transform).c1;
  fVar19 = (root->transform).c2;
  fVar20 = (root->transform).c3;
  fVar21 = (root->transform).c4;
  fVar15 = (root->transform).d2;
  fVar16 = (root->transform).d3;
  fVar17 = (root->transform).d4;
  (paVar35->mTransformation).d1 = (root->transform).d1;
  (paVar35->mTransformation).d2 = fVar15;
  (paVar35->mTransformation).d3 = fVar16;
  (paVar35->mTransformation).d4 = fVar17;
  (paVar35->mTransformation).c1 = fVar18;
  (paVar35->mTransformation).c2 = fVar19;
  (paVar35->mTransformation).c3 = fVar20;
  (paVar35->mTransformation).c4 = fVar21;
  (paVar35->mTransformation).b1 = fVar22;
  (paVar35->mTransformation).b2 = fVar23;
  (paVar35->mTransformation).b3 = fVar24;
  (paVar35->mTransformation).b4 = fVar25;
  (paVar35->mTransformation).a1 = fVar26;
  (paVar35->mTransformation).a2 = fVar27;
  (paVar35->mTransformation).a3 = fVar28;
  (paVar35->mTransformation).a4 = fVar29;
  TVar4 = root->type;
  local_690 = paVar35;
  if (TVar4 == TYPE_CAMERA) {
    paVar48 = (aiCamera *)operator_new(0x438);
    (paVar48->mName).length = 0;
    (paVar48->mName).data[0] = '\0';
    memset((paVar48->mName).data + 1,0x1b,0x3ff);
    (paVar48->mPosition).x = 0.0;
    (paVar48->mPosition).y = 0.0;
    *(undefined8 *)&(paVar48->mPosition).z = 0;
    (paVar48->mUp).y = 1.0;
    (paVar48->mUp).z = 0.0;
    (paVar48->mLookAt).x = 0.0;
    (paVar48->mLookAt).y = 0.0;
    *(undefined8 *)&(paVar48->mLookAt).z = 0x3f490fdb3f800000;
    paVar48->mClipPlaneNear = 0.1;
    paVar48->mClipPlaneFar = 1000.0;
    paVar48->mAspect = 0.0;
    uVar33 = local_698->mNumCameras;
    local_698->mNumCameras = uVar33 + 1;
    local_698->mCameras[uVar33] = paVar48;
    uVar56 = (root->name)._M_string_length;
    if (uVar56 < 0x400) {
      (paVar48->mName).length = (ai_uint32)uVar56;
      memcpy((paVar48->mName).data,(root->name)._M_dataplus._M_p,uVar56);
      (paVar48->mName).data[uVar56] = '\0';
    }
  }
  else if (TVar4 == TYPE_LIGHT) {
    paVar47 = (aiLight *)operator_new(0x46c);
    (paVar47->mName).length = 0;
    (paVar47->mName).data[0] = '\0';
    memset((paVar47->mName).data + 1,0x1b,0x3ff);
    paVar47->mType = aiLightSource_UNDEFINED;
    (paVar47->mPosition).x = 0.0;
    (paVar47->mPosition).y = 0.0;
    (paVar47->mPosition).z = 0.0;
    (paVar47->mDirection).x = 0.0;
    (paVar47->mDirection).y = 0.0;
    *(undefined8 *)&(paVar47->mDirection).z = 0;
    (paVar47->mUp).x = 0.0;
    (paVar47->mUp).y = 0.0;
    *(undefined8 *)&(paVar47->mUp).z = 0;
    paVar47->mAttenuationLinear = 1.0;
    paVar47->mAttenuationQuadratic = 0.0;
    (paVar47->mColorDiffuse).r = 0.0;
    (paVar47->mColorDiffuse).g = 0.0;
    (paVar47->mColorDiffuse).b = 0.0;
    (paVar47->mColorSpecular).r = 0.0;
    (paVar47->mColorSpecular).g = 0.0;
    *(undefined8 *)&(paVar47->mColorSpecular).b = 0;
    (paVar47->mColorAmbient).g = 0.0;
    (paVar47->mColorAmbient).b = 0.0;
    paVar47->mAngleInnerCone = 6.2831855;
    paVar47->mAngleOuterCone = 6.2831855;
    (paVar47->mSize).x = 0.0;
    (paVar47->mSize).y = 0.0;
    uVar33 = local_698->mNumLights;
    local_698->mNumLights = uVar33 + 1;
    local_698->mLights[uVar33] = paVar47;
    uVar56 = (root->name)._M_string_length;
    if (uVar56 < 0x400) {
      (paVar47->mName).length = (ai_uint32)uVar56;
      memcpy((paVar47->mName).data,(root->name)._M_dataplus._M_p,uVar56);
      (paVar47->mName).data[uVar56] = '\0';
    }
    aVar1 = *(ai_real *)&root->field_0xd4;
    (paVar47->mColorSpecular).r = aVar1;
    aVar2 = *(ai_real *)&root[1]._vptr_Node;
    (paVar47->mColorSpecular).g = aVar2;
    aVar3 = *(ai_real *)((long)&root[1]._vptr_Node + 4);
    (paVar47->mColorSpecular).b = aVar3;
    (paVar47->mColorAmbient).r = aVar1;
    (paVar47->mColorAmbient).g = aVar2;
    (paVar47->mColorAmbient).b = aVar3;
    (paVar47->mColorDiffuse).r = aVar1;
    (paVar47->mColorDiffuse).g = aVar2;
    (paVar47->mColorDiffuse).b = aVar3;
    paVar47->mAngleOuterCone = (float)root[1].super_ChunkInfo.id * 0.017453292;
    paVar47->mAngleInnerCone = (float)root[1].super_ChunkInfo.parent_id * 0.017453292;
    paVar47->mType = (uint)(root[1].super_ChunkInfo.version == 0) * 2 + aiLightSource_DIRECTIONAL;
  }
  else if (((TVar4 == TYPE_MESH) &&
           (root[1].temp_children.
            super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_map != *(_Map_pointer *)&root[1].type)) &&
          (*(_func_int ***)&root[1].super_ChunkInfo != root[1]._vptr_Node)) {
    p_Var46 = (_Rb_tree_node_base *)
              root[1].temp_children.
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_640 = (_Rb_tree_node_base *)
                &root[1].temp_children.
                 super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (p_Var46 != local_640) {
      do {
        local_628 = p_Var46[1]._M_color;
        std::deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::deque
                  ((deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)&local_620,
                   (deque<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_> *)
                   &p_Var46[1]._M_parent);
        if (local_620._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_620._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          uVar56 = 0;
        }
        else {
          uVar56 = 0;
          pppFVar50 = local_620._M_impl.super__Deque_impl_data._M_start._M_node;
          ppFVar52 = local_620._M_impl.super__Deque_impl_data._M_start._M_last;
          ppFVar54 = local_620._M_impl.super__Deque_impl_data._M_start._M_cur;
          do {
            ppFVar55 = ppFVar54 + 1;
            if (ppFVar55 == ppFVar52) {
              ppFVar55 = pppFVar50[1];
              pppFVar50 = pppFVar50 + 1;
              ppFVar52 = ppFVar55 + 0x40;
            }
            uVar56 = uVar56 + ((long)((*ppFVar54)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)((*ppFVar54)->indices).
                                     super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
            ppFVar54 = ppFVar55;
          } while (ppFVar55 != local_620._M_impl.super__Deque_impl_data._M_finish._M_cur);
        }
        if (uVar56 != 0) {
          local_638 = p_Var46;
          paVar36 = (aiMesh *)operator_new(0x520);
          paVar36->mPrimitiveTypes = 0;
          paVar36->mNumVertices = 0;
          paVar36->mNumFaces = 0;
          memset(&paVar36->mVertices,0,0xcc);
          paVar36->mBones = (aiBone **)0x0;
          paVar36->mMaterialIndex = 0;
          (paVar36->mName).length = 0;
          (paVar36->mName).data[0] = '\0';
          memset((paVar36->mName).data + 1,0x1b,0x3ff);
          paVar36->mNumAnimMeshes = 0;
          paVar36->mAnimMeshes = (aiAnimMesh **)0x0;
          paVar36->mMethod = 0;
          (paVar36->mAABB).mMin.x = 0.0;
          (paVar36->mAABB).mMin.y = 0.0;
          (paVar36->mAABB).mMin.z = 0.0;
          (paVar36->mAABB).mMax.x = 0.0;
          (paVar36->mAABB).mMax.y = 0.0;
          (paVar36->mAABB).mMax.z = 0.0;
          paVar36->mTextureCoords[0] = (aiVector3D *)0x0;
          paVar36->mTextureCoords[1] = (aiVector3D *)0x0;
          paVar36->mTextureCoords[2] = (aiVector3D *)0x0;
          paVar36->mTextureCoords[3] = (aiVector3D *)0x0;
          paVar36->mTextureCoords[4] = (aiVector3D *)0x0;
          paVar36->mTextureCoords[5] = (aiVector3D *)0x0;
          paVar36->mTextureCoords[6] = (aiVector3D *)0x0;
          paVar36->mTextureCoords[7] = (aiVector3D *)0x0;
          paVar36->mNumUVComponents[0] = 0;
          paVar36->mNumUVComponents[1] = 0;
          paVar36->mNumUVComponents[2] = 0;
          paVar36->mNumUVComponents[3] = 0;
          paVar36->mNumUVComponents[4] = 0;
          paVar36->mNumUVComponents[5] = 0;
          paVar36->mNumUVComponents[6] = 0;
          paVar36->mNumUVComponents[7] = 0;
          paVar36->mColors[0] = (aiColor4D *)0x0;
          paVar36->mColors[1] = (aiColor4D *)0x0;
          paVar36->mColors[2] = (aiColor4D *)0x0;
          paVar36->mColors[3] = (aiColor4D *)0x0;
          paVar36->mColors[4] = (aiColor4D *)0x0;
          paVar36->mColors[5] = (aiColor4D *)0x0;
          paVar36->mColors[6] = (aiColor4D *)0x0;
          paVar36->mColors[7] = (aiColor4D *)0x0;
          uVar33 = local_698->mNumMeshes;
          local_698->mNumMeshes = uVar33 + 1;
          local_698->mMeshes[uVar33] = paVar36;
          local_690->mNumMeshes = local_690->mNumMeshes + 1;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = uVar56;
          uVar37 = SUB168(auVar14 * ZEXT816(0xc),0);
          if (SUB168(auVar14 * ZEXT816(0xc),8) != 0) {
            uVar37 = 0xffffffffffffffff;
          }
          paVar38 = (aiVector3D *)operator_new__(uVar37);
          uVar56 = uVar56 * 0xc - 0xc;
          memset(paVar38,0,(uVar56 / 0xc) * 0xc + 0xc);
          paVar36->mVertices = paVar38;
          paVar38 = (aiVector3D *)operator_new__(uVar37);
          memset(paVar38,0,(uVar56 / 0xc) * 0xc + 0xc);
          ppFVar52 = local_620._M_impl.super__Deque_impl_data._M_start._M_last;
          ppFVar54 = local_620._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_688 = local_620._M_impl.super__Deque_impl_data._M_start._M_node;
          paVar36->mTextureCoords[0] = paVar38;
          local_678 = local_620._M_impl.super__Deque_impl_data._M_finish._M_cur;
          uVar56 = ((long)local_620._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_620._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
                   ((long)local_620._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_620._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
                   ((((ulong)((long)local_620._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_620._M_impl.super__Deque_impl_data._M_start._M_node) >> 3)
                    - 1) + (ulong)(local_620._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                  (_Map_pointer)0x0)) * 0x40;
          puVar39 = (ulong *)operator_new__(-(ulong)(uVar56 >> 0x3c != 0) | uVar56 * 0x10 | 8);
          *puVar39 = uVar56;
          paVar40 = (aiFace *)(puVar39 + 1);
          if (uVar56 != 0) {
            paVar51 = paVar40;
            do {
              paVar51->mNumIndices = 0;
              paVar51->mIndices = (uint *)0x0;
              paVar51 = paVar51 + 1;
            } while (paVar51 != paVar40 + uVar56);
          }
          paVar36->mFaces = paVar40;
          while (paVar30 = local_698, ppFVar54 != local_678) {
            pFVar7 = *ppFVar54;
            if ((pFVar7->indices).
                super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pFVar7->indices).
                super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              uVar33 = paVar36->mNumFaces;
              paVar36->mNumFaces = uVar33 + 1;
              paVar40 = paVar36->mFaces + uVar33;
              lVar41 = (long)(pFVar7->indices).
                             super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pFVar7->indices).
                             super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              uVar56 = lVar41 >> 1;
              if (lVar41 < 0) {
                uVar56 = 0xffffffffffffffff;
              }
              puVar42 = (uint *)operator_new__(uVar56);
              paVar40->mIndices = puVar42;
              pVVar8 = (pFVar7->indices).
                       super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pVVar43 = (pFVar7->indices).
                             super__Vector_base<Assimp::COB::VertexIndex,_std::allocator<Assimp::COB::VertexIndex>_>
                             ._M_impl.super__Vector_impl_data._M_start; pVVar43 != pVVar8;
                  pVVar43 = pVVar43 + 1) {
                uVar56 = (ulong)pVVar43->pos_idx;
                lVar41 = *(long *)&root[1].type;
                uVar37 = ((long)root[1].temp_children.
                                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                                ._M_impl.super__Deque_impl_data._M_map - lVar41 >> 2) *
                         -0x5555555555555555;
                if (uVar37 < uVar56 || uVar37 - uVar56 == 0) {
                  local_438._0_8_ = local_438.data + 0xc;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_438,"Position index out of range","");
                  ThrowException((string *)&local_438);
                }
                if ((ulong)(*(long *)&root[1].super_ChunkInfo - (long)root[1]._vptr_Node >> 3) <=
                    (ulong)pVVar43->uv_idx) {
                  local_438._0_8_ = local_438.data + 0xc;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_438,"UV index out of range","");
                  ThrowException((string *)&local_438);
                }
                paVar38 = paVar36->mVertices;
                uVar33 = paVar36->mNumVertices;
                paVar38[uVar33].z = *(float *)(lVar41 + 8 + uVar56 * 0xc);
                uVar9 = *(undefined8 *)(lVar41 + uVar56 * 0xc);
                paVar38 = paVar38 + uVar33;
                paVar38->x = (float)(int)uVar9;
                paVar38->y = (float)(int)((ulong)uVar9 >> 0x20);
                paVar38 = paVar36->mTextureCoords[0];
                uVar33 = paVar36->mNumVertices;
                *(_func_int **)(paVar38 + uVar33) = root[1]._vptr_Node[pVVar43->uv_idx];
                paVar38[uVar33].z = 0.0;
                uVar33 = paVar36->mNumVertices;
                paVar36->mNumVertices = uVar33 + 1;
                uVar5 = paVar40->mNumIndices;
                paVar40->mNumIndices = uVar5 + 1;
                paVar40->mIndices[uVar5] = uVar33;
              }
            }
            ppFVar54 = ppFVar54 + 1;
            if (ppFVar54 == ppFVar52) {
              ppFVar54 = local_688[1];
              local_688 = local_688 + 1;
              ppFVar52 = ppFVar54 + 0x40;
            }
          }
          paVar36->mMaterialIndex = local_698->mNumMaterials;
          pMVar44 = (local_680->materials).
                    super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar10 = (local_680->materials).
                    super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pMVar44 == pMVar10) {
            pMVar45 = (pointer)0x0;
          }
          else {
            pMVar45 = (pointer)0x0;
            do {
              if (((pMVar44->super_ChunkInfo).parent_id != (root->super_ChunkInfo).id) ||
                 (bVar59 = true, pMVar32 = pMVar44, pMVar44->matnum != local_628)) {
                bVar59 = false;
                pMVar32 = pMVar45;
              }
              pMVar45 = pMVar32;
            } while ((!bVar59) && (pMVar44 = pMVar44 + 1, pMVar44 != pMVar10));
          }
          local_6a0 = (pointer)0x0;
          if (pMVar45 == (pointer)0x0) {
            this_00 = DefaultLogger::get();
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438,"Could not resolve material index ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_438);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438," - creating default material for this slot",0x2a);
            std::__cxx11::stringbuf::str();
            Logger::debug(this_00,(char *)CONCAT44(fStack_5ac,local_5b0));
            if ((undefined1 *)CONCAT44(fStack_5ac,local_5b0) != local_5a0) {
              operator_delete((undefined1 *)CONCAT44(fStack_5ac,local_5b0));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
            std::ios_base::~ios_base((ios_base *)(local_438.data + 0x6c));
            pMVar45 = (pointer)operator_new(0x90);
            pMVar44 = local_6a0;
            (pMVar45->super_ChunkInfo).id = 0;
            (pMVar45->super_ChunkInfo).parent_id = 0;
            (pMVar45->super_ChunkInfo).version = 0;
            (pMVar45->super_ChunkInfo).size = 0xffffffff;
            (pMVar45->type)._M_dataplus._M_p = (pointer)&(pMVar45->type).field_2;
            (pMVar45->type)._M_string_length = 0;
            (pMVar45->type).field_2._M_local_buf[0] = '\0';
            (pMVar45->rgb).r = 0.0;
            (pMVar45->rgb).g = 0.0;
            *(undefined8 *)&(pMVar45->rgb).b = 0;
            pMVar45->alpha = 0.0;
            pMVar45->exp = 0.0;
            pMVar45->ior = 0.0;
            pMVar45->ka = 0.0;
            pMVar45->ks = 1.0;
            pMVar45->matnum = 0xffffffff;
            pMVar45->shader = FLAT;
            pMVar45->autofacet = FACETED;
            *(undefined8 *)&pMVar45->autofacet_angle = 0;
            *(undefined8 *)
             ((long)&(pMVar45->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar45->tex_env).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            *(undefined8 *)
             ((long)&(pMVar45->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
             ) = 0;
            *(undefined8 *)
             ((long)&(pMVar45->tex_bump).
                     super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4) = 0;
            (pMVar45->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (pMVar45->tex_color).
            super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            bVar59 = local_6a0 != (Material *)0x0;
            local_6a0 = pMVar45;
            if (bVar59) {
              std::default_delete<const_Assimp::COB::Material>::operator()
                        ((default_delete<const_Assimp::COB::Material> *)&local_6a0,pMVar44);
            }
          }
          this_01 = (aiMaterial *)operator_new(0x10);
          aiMaterial::aiMaterial(this_01);
          uVar33 = paVar30->mNumMaterials;
          paVar30->mNumMaterials = uVar33 + 1;
          paVar30->mMaterials[uVar33] = this_01;
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[6]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_5b0,(char (*) [6])"#mat_");
          std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_5b0,"_",1);
          std::ostream::_M_insert<unsigned_long>((ulong)&local_5b0);
          std::__cxx11::stringbuf::str();
          puVar31 = local_5d0;
          __n = local_5c8 & 0xffffffff;
          if ((local_5c8 & 0xfffffc00) != 0) {
            __n = 0x3ff;
          }
          local_438.length = (ai_uint32)__n;
          memcpy((void *)((long)&local_438 + 4),local_5d0,__n);
          *(undefined1 *)((long)&local_438 + __n + 4) = 0;
          if (puVar31 != local_5c0) {
            operator_delete(puVar31);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_5b0);
          std::ios_base::~ios_base(local_540);
          aiMaterial::AddProperty(this_01,&local_438,"?mat.name",0,0);
          p_Var46 = local_638;
          uVar33 = *(uint *)&root[1].temp_children.
                             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node & 4;
          local_5b0 = (float)(uVar33 >> 2);
          if (uVar33 != 0) {
            aiMaterial::AddBinaryProperty(this_01,&local_5b0,4,"$mat.wireframe",0,0,aiPTI_Integer);
          }
          SVar6 = pMVar45->shader;
          if (SVar6 == METAL) {
            local_5b0 = 1.12104e-44;
          }
          else if (SVar6 == PHONG) {
            local_5b0 = 4.2039e-45;
          }
          else {
            if (SVar6 != FLAT) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/COB/COBLoader.cpp"
                            ,0x152,
                            "aiNode *Assimp::COBImporter::BuildNodes(const Node &, const Scene &, aiScene *)"
                           );
            }
            local_5b0 = 2.8026e-45;
          }
          aiMaterial::AddBinaryProperty(this_01,&local_5b0,4,"$mat.shadingm",0,0,aiPTI_Integer);
          if (local_5b0 != 2.8026e-45) {
            aiMaterial::AddBinaryProperty(this_01,&pMVar45->exp,4,"$mat.shininess",0,0,aiPTI_Float);
          }
          aiMaterial::AddBinaryProperty(this_01,&pMVar45->ior,4,"$mat.refracti",0,0,aiPTI_Float);
          aiMaterial::AddBinaryProperty(this_01,&pMVar45->rgb,0xc,"$clr.diffuse",0,0,aiPTI_Float);
          local_5a8 = pMVar45->ks;
          local_5b0 = (pMVar45->rgb).r * local_5a8;
          fStack_5ac = (pMVar45->rgb).g * local_5a8;
          local_5a8 = local_5a8 * (pMVar45->rgb).b;
          aiMaterial::AddBinaryProperty(this_01,&local_5b0,0xc,"$clr.specular",0,0,aiPTI_Float);
          local_5a8 = pMVar45->ka;
          local_5b0 = (pMVar45->rgb).r * local_5a8;
          fStack_5ac = (pMVar45->rgb).g * local_5a8;
          local_5a8 = local_5a8 * (pMVar45->rgb).b;
          aiMaterial::AddBinaryProperty(this_01,&local_5b0,0xc,"$clr.ambient",0,0,aiPTI_Float);
          peVar11 = (pMVar45->tex_color).
                    super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar11 != (element_type *)0x0) {
            local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (pMVar45->tex_color).
                 super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar11;
            ConvertTexture(&local_650,this_01,aiTextureType_DIFFUSE);
            if (local_650.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_650.
                         super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          peVar11 = (pMVar45->tex_env).
                    super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar11 != (element_type *)0x0) {
            local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (pMVar45->tex_env).
                 super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar11;
            ConvertTexture(&local_660,this_01,aiTextureType_UNKNOWN);
            if (local_660.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_660.
                         super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          peVar11 = (pMVar45->tex_bump).
                    super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar11 != (element_type *)0x0) {
            local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (pMVar45->tex_bump).
                 super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
            if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 peVar11;
            ConvertTexture(&local_670,this_01,aiTextureType_HEIGHT);
            if (local_670.super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_670.
                         super___shared_ptr<Assimp::COB::Texture,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if (local_6a0 != (Material *)0x0) {
            std::default_delete<const_Assimp::COB::Material>::operator()
                      ((default_delete<const_Assimp::COB::Material> *)&local_6a0,local_6a0);
          }
        }
        std::_Deque_base<Assimp::COB::Face_*,_std::allocator<Assimp::COB::Face_*>_>::~_Deque_base
                  (&local_620);
        p_Var46 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var46);
      } while (p_Var46 != local_640);
    }
  }
  paVar35 = local_690;
  paVar30 = local_698;
  if ((ulong)local_690->mNumMeshes != 0) {
    puVar42 = (uint *)operator_new__((ulong)local_690->mNumMeshes << 2);
    paVar35->mMeshes = puVar42;
    if (paVar35->mNumMeshes != 0) {
      iVar34 = -1;
      uVar56 = 0;
      do {
        paVar35->mMeshes[uVar56] = paVar30->mNumMeshes + iVar34;
        uVar56 = uVar56 + 1;
        iVar34 = iVar34 + -1;
      } while (uVar56 < paVar35->mNumMeshes);
    }
  }
  pppNVar12 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppNVar58 = (root->temp_children).
              super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  ppNVar13 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppNVar57 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppNVar53 = (root->temp_children).
             super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar56 = ((long)ppNVar53 - (long)ppNVar57 >> 3) +
           ((long)ppNVar13 -
            (long)(root->temp_children).
                  super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
           ((((ulong)((long)pppNVar12 - (long)pppNVar58) >> 3) - 1) +
           (ulong)(pppNVar12 == (_Map_pointer)0x0)) * 0x40;
  uVar56 = -(ulong)(uVar56 >> 0x3d != 0) | uVar56 * 8;
  __s = (aiNode **)operator_new__(uVar56);
  paVar30 = local_698;
  memset(__s,0,uVar56);
  paVar35 = local_690;
  local_690->mChildren = __s;
  while (ppNVar57 != ppNVar13) {
    paVar49 = BuildNodes(local_630,*ppNVar57,local_680,paVar30);
    uVar33 = paVar35->mNumChildren;
    paVar35->mNumChildren = uVar33 + 1;
    paVar35->mChildren[uVar33] = paVar49;
    paVar49->mParent = paVar35;
    ppNVar57 = ppNVar57 + 1;
    if (ppNVar57 == ppNVar53) {
      ppNVar57 = pppNVar58[1];
      pppNVar58 = pppNVar58 + 1;
      ppNVar53 = ppNVar57 + 0x40;
    }
  }
  return paVar35;
}

Assistant:

aiNode* COBImporter::BuildNodes(const Node& root,const Scene& scin,aiScene* fill)
{
    aiNode* nd = new aiNode();
    nd->mName.Set(root.name);
    nd->mTransformation = root.transform;

    // Note to everybody believing Voodoo is appropriate here:
    // I know polymorphism, run as fast as you can ;-)
    if (Node::TYPE_MESH == root.type) {
        const Mesh& ndmesh = (const Mesh&)(root);
        if (ndmesh.vertex_positions.size() && ndmesh.texture_coords.size()) {

            typedef std::pair<unsigned int,Mesh::FaceRefList> Entry;
            for(const Entry& reflist : ndmesh.temp_map) {
                {   // create mesh
                    size_t n = 0;
                    for(Face* f : reflist.second) {
                        n += f->indices.size();
                    }
                    if (!n) {
                        continue;
                    }
                    aiMesh* outmesh = fill->mMeshes[fill->mNumMeshes++] = new aiMesh();
                    ++nd->mNumMeshes;

                    outmesh->mVertices = new aiVector3D[n];
                    outmesh->mTextureCoords[0] = new aiVector3D[n];

                    outmesh->mFaces = new aiFace[reflist.second.size()]();
                    for(Face* f : reflist.second) {
                        if (f->indices.empty()) {
                            continue;
                        }

                        aiFace& fout = outmesh->mFaces[outmesh->mNumFaces++];
                        fout.mIndices = new unsigned int[f->indices.size()];

                        for(VertexIndex& v : f->indices) {
                            if (v.pos_idx >= ndmesh.vertex_positions.size()) {
                                ThrowException("Position index out of range");
                            }
                            if (v.uv_idx >= ndmesh.texture_coords.size()) {
                                ThrowException("UV index out of range");
                            }
                            outmesh->mVertices[outmesh->mNumVertices] = ndmesh.vertex_positions[ v.pos_idx ];
                            outmesh->mTextureCoords[0][outmesh->mNumVertices] = aiVector3D(
                                ndmesh.texture_coords[ v.uv_idx ].x,
                                ndmesh.texture_coords[ v.uv_idx ].y,
                                0.f
                            );

                            fout.mIndices[fout.mNumIndices++] = outmesh->mNumVertices++;
                        }
                    }
                    outmesh->mMaterialIndex = fill->mNumMaterials;
                }{  // create material
                    const Material* min = NULL;
                    for(const Material& m : scin.materials) {
                        if (m.parent_id == ndmesh.id && m.matnum == reflist.first) {
                            min = &m;
                            break;
                        }
                    }
                    std::unique_ptr<const Material> defmat;
                    if(!min) {
                        ASSIMP_LOG_DEBUG(format()<<"Could not resolve material index "
                            <<reflist.first<<" - creating default material for this slot");

                        defmat.reset(min=new Material());
                    }

                    aiMaterial* mat = new aiMaterial();
                    fill->mMaterials[fill->mNumMaterials++] = mat;

                    const aiString s(format("#mat_")<<fill->mNumMeshes<<"_"<<min->matnum);
                    mat->AddProperty(&s,AI_MATKEY_NAME);

                    if(int tmp = ndmesh.draw_flags & Mesh::WIRED ? 1 : 0) {
                        mat->AddProperty(&tmp,1,AI_MATKEY_ENABLE_WIREFRAME);
                    }

                    {   int shader;
                        switch(min->shader)
                        {
                        case Material::FLAT:
                            shader = aiShadingMode_Gouraud;
                            break;

                        case Material::PHONG:
                            shader = aiShadingMode_Phong;
                            break;

                        case Material::METAL:
                            shader = aiShadingMode_CookTorrance;
                            break;

                        default:
                            ai_assert(false); // shouldn't be here
                        }
                        mat->AddProperty(&shader,1,AI_MATKEY_SHADING_MODEL);
                        if(shader != aiShadingMode_Gouraud) {
                            mat->AddProperty(&min->exp,1,AI_MATKEY_SHININESS);
                        }
                    }

                    mat->AddProperty(&min->ior,1,AI_MATKEY_REFRACTI);
                    mat->AddProperty(&min->rgb,1,AI_MATKEY_COLOR_DIFFUSE);

                    aiColor3D c = aiColor3D(min->rgb)*min->ks;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_SPECULAR);

                    c = aiColor3D(min->rgb)*min->ka;
                    mat->AddProperty(&c,1,AI_MATKEY_COLOR_AMBIENT);

                    // convert textures if some exist.
                    if(min->tex_color) {
                        ConvertTexture(min->tex_color,mat,aiTextureType_DIFFUSE);
                    }
                    if(min->tex_env) {
                        ConvertTexture(min->tex_env  ,mat,aiTextureType_UNKNOWN);
                    }
                    if(min->tex_bump) {
                        ConvertTexture(min->tex_bump ,mat,aiTextureType_HEIGHT);
                    }
                }
            }
        }
    }
    else if (Node::TYPE_LIGHT == root.type) {
        const Light& ndlight = (const Light&)(root);
        aiLight* outlight = fill->mLights[fill->mNumLights++] = new aiLight();

        outlight->mName.Set(ndlight.name);
        outlight->mColorDiffuse = outlight->mColorAmbient = outlight->mColorSpecular = ndlight.color;

        outlight->mAngleOuterCone = AI_DEG_TO_RAD(ndlight.angle);
        outlight->mAngleInnerCone = AI_DEG_TO_RAD(ndlight.inner_angle);

        // XXX
        outlight->mType = ndlight.ltype==Light::SPOT ? aiLightSource_SPOT : aiLightSource_DIRECTIONAL;
    }
    else if (Node::TYPE_CAMERA == root.type) {
        const Camera& ndcam = (const Camera&)(root);
        aiCamera* outcam = fill->mCameras[fill->mNumCameras++] = new aiCamera();

        outcam->mName.Set(ndcam.name);
    }

    // add meshes
    if (nd->mNumMeshes) { // mMeshes must be NULL if count is 0
        nd->mMeshes = new unsigned int[nd->mNumMeshes];
        for(unsigned int i = 0; i < nd->mNumMeshes;++i) {
            nd->mMeshes[i] = fill->mNumMeshes-i-1;
        }
    }

    // add children recursively
    nd->mChildren = new aiNode*[root.temp_children.size()]();
    for(const Node* n : root.temp_children) {
        (nd->mChildren[nd->mNumChildren++] = BuildNodes(*n,scin,fill))->mParent = nd;
    }

    return nd;
}